

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderIndexingTests.cpp
# Opt level: O3

void __thiscall
deqp::ShaderIndexingCase::setupUniforms
          (ShaderIndexingCase *this,deUint32 programID,Vec4 *constCoords)

{
  int iVar1;
  undefined4 extraout_var;
  int i;
  long lVar3;
  Vector<float,_3> res;
  Vec4 arr [4];
  undefined8 local_88;
  undefined4 local_80;
  undefined8 local_78;
  float local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float fStack_58;
  float fStack_54;
  undefined8 uStack_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  long lVar2;
  
  iVar1 = (*((this->super_ShaderRenderCase).m_renderCtx)->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  iVar1 = (**(code **)(lVar2 + 0xb48))(programID,"u_arr");
  if (iVar1 != -1) {
    switch(this->m_varType) {
    case TYPE_FLOAT:
      local_68 = constCoords->m_data[0];
      fStack_64 = local_68 * 0.5;
      fStack_60 = local_68 * 0.25;
      fStack_5c = local_68 * 0.125;
      (**(code **)(lVar2 + 0x14e8))(iVar1,4);
      break;
    case TYPE_FLOAT_VEC2:
      local_68 = (float)*(undefined8 *)constCoords->m_data;
      fStack_64 = (float)((ulong)*(undefined8 *)constCoords->m_data >> 0x20);
      fStack_60 = local_68 * 0.5;
      fStack_5c = fStack_64 * 0.5;
      fStack_58 = local_68 * 0.25;
      fStack_54 = fStack_64 * 0.25;
      uStack_50 = CONCAT44(fStack_64 * 0.125,local_68 * 0.125);
      (**(code **)(lVar2 + 0x1528))(iVar1,4);
      break;
    case TYPE_FLOAT_VEC3:
      local_78 = *(undefined8 *)constCoords->m_data;
      fStack_60 = constCoords->m_data[2];
      local_68 = (float)local_78;
      fStack_64 = (float)((ulong)local_78 >> 0x20);
      local_70 = fStack_60;
      local_88 = 0;
      local_80 = 0;
      lVar3 = 0;
      do {
        *(float *)((long)&local_88 + lVar3 * 4) = *(float *)((long)&local_78 + lVar3 * 4) * 0.5;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      fStack_54 = (float)local_80;
      fStack_5c = (float)local_88;
      fStack_58 = (float)((ulong)local_88 >> 0x20);
      local_88 = 0;
      local_80 = 0;
      lVar3 = 0;
      do {
        *(float *)((long)&local_88 + lVar3 * 4) = *(float *)((long)&local_78 + lVar3 * 4) * 0.25;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      local_48 = (float)local_80;
      uStack_50 = local_88;
      local_88 = 0;
      local_80 = 0;
      lVar3 = 0;
      do {
        *(float *)((long)&local_88 + lVar3 * 4) = *(float *)((long)&local_78 + lVar3 * 4) * 0.125;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      fStack_3c = (float)local_80;
      fStack_44 = (float)local_88;
      fStack_40 = (float)((ulong)local_88 >> 0x20);
      (**(code **)(lVar2 + 0x1568))(iVar1,4);
      break;
    case TYPE_FLOAT_VEC4:
      local_68 = constCoords->m_data[0];
      fStack_64 = constCoords->m_data[1];
      fStack_60 = constCoords->m_data[2];
      fStack_5c = constCoords->m_data[3];
      fStack_58 = local_68 * 0.5;
      fStack_54 = fStack_64 * 0.5;
      uStack_50 = CONCAT44(fStack_5c * 0.5,fStack_60 * 0.5);
      local_48 = local_68 * 0.25;
      fStack_44 = fStack_64 * 0.25;
      fStack_40 = fStack_60 * 0.25;
      fStack_3c = fStack_5c * 0.25;
      _local_38 = CONCAT44(fStack_64 * 0.125,local_68 * 0.125);
      _fStack_30 = CONCAT44(fStack_5c * 0.125,fStack_60 * 0.125);
      (**(code **)(lVar2 + 0x15a8))(iVar1,4);
      break;
    default:
      deAssertFail("false",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderIndexingTests.cpp"
                   ,0xee);
      return;
    }
  }
  return;
}

Assistant:

void ShaderIndexingCase::setupUniforms(deUint32 programID, const Vec4& constCoords)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	DE_UNREF(constCoords);

	int arrLoc = gl.getUniformLocation(programID, "u_arr");
	if (arrLoc != -1)
	{
		//int scalarSize = getDataTypeScalarSize(m_varType);
		if (m_varType == TYPE_FLOAT)
		{
			float arr[4];
			arr[0] = constCoords.x();
			arr[1] = constCoords.x() * 0.5f;
			arr[2] = constCoords.x() * 0.25f;
			arr[3] = constCoords.x() * 0.125f;
			gl.uniform1fv(arrLoc, 4, &arr[0]);
		}
		else if (m_varType == TYPE_FLOAT_VEC2)
		{
			Vec2 arr[4];
			arr[0] = constCoords.swizzle(0, 1);
			arr[1] = constCoords.swizzle(0, 1) * 0.5f;
			arr[2] = constCoords.swizzle(0, 1) * 0.25f;
			arr[3] = constCoords.swizzle(0, 1) * 0.125f;
			gl.uniform2fv(arrLoc, 4, arr[0].getPtr());
		}
		else if (m_varType == TYPE_FLOAT_VEC3)
		{
			Vec3 arr[4];
			arr[0] = constCoords.swizzle(0, 1, 2);
			arr[1] = constCoords.swizzle(0, 1, 2) * 0.5f;
			arr[2] = constCoords.swizzle(0, 1, 2) * 0.25f;
			arr[3] = constCoords.swizzle(0, 1, 2) * 0.125f;
			gl.uniform3fv(arrLoc, 4, arr[0].getPtr());
		}
		else if (m_varType == TYPE_FLOAT_VEC4)
		{
			Vec4 arr[4];
			arr[0] = constCoords.swizzle(0, 1, 2, 3);
			arr[1] = constCoords.swizzle(0, 1, 2, 3) * 0.5f;
			arr[2] = constCoords.swizzle(0, 1, 2, 3) * 0.25f;
			arr[3] = constCoords.swizzle(0, 1, 2, 3) * 0.125f;
			gl.uniform4fv(arrLoc, 4, arr[0].getPtr());
		}
		else
			DE_TEST_ASSERT(false);
	}
}